

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnLocalTee(SharedValidator *this,Location *loc,Var *param_2)

{
  Result RVar1;
  Result RVar2;
  Type type;
  Type local_6c;
  Var local_68;
  
  local_6c.enum_ = Any;
  this->expr_loc_ = loc;
  Var::Var(&local_68,param_2);
  RVar1 = CheckLocalIndex(this,&local_68,&local_6c);
  Var::~Var(&local_68);
  RVar2 = TypeChecker::OnLocalTee(&this->typechecker_,local_6c);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnLocalTee(const Location& loc, Var local_var) {
  Result result = Result::Ok;
  Type type = Type::Any;
  expr_loc_ = &loc;
  result |= CheckLocalIndex(local_var, &type);
  result |= typechecker_.OnLocalTee(type);
  return result;
}